

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

void __thiscall
ktx::CommandCompare::compareLevelIndex(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char **ppcVar1;
  ktx_uint32_t kVar2;
  pointer pKVar3;
  uint uVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  bool bVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar13;
  unsigned_long *puVar14;
  uint uVar15;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  ktxLevelIndexEntry entry;
  optional<ktxLevelIndexEntry> levelIndexEntry [2];
  string local_188;
  string local_168;
  PrintDiff *local_148;
  DiffBase<unsigned_long> local_140;
  uint local_ec;
  char *local_e8 [3];
  CommandCompare *local_d0;
  char *local_c8;
  InputStreams *local_c0;
  unsigned_long local_b8;
  unsigned_long local_b0;
  unsigned_long local_a8;
  unsigned_long local_a0;
  unsigned_long local_98;
  unsigned_long local_90;
  unsigned_long local_88;
  unsigned_long uStack_80;
  unsigned_long local_78;
  byte local_70;
  unsigned_long local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  byte local_50;
  undefined8 local_40;
  char *pcStack_38;
  
  if ((this->options).super_OptionsCompare.ignoreIndex == none) {
    ppcVar1 = &local_140.textHeader._M_str;
    local_148 = diff;
    local_140._vptr_DiffBase = (_func_int **)ppcVar1;
    local_d0 = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Level Index\n\n","");
    this_00 = &local_148->context;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(this_00,(local_148->context).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140);
    if (local_140._vptr_DiffBase != (_func_int **)ppcVar1) {
      operator_delete(local_140._vptr_DiffBase,(ulong)(local_140.textHeader._M_str + 1));
    }
    pKVar3 = (local_d0->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>.
             _M_impl.super__Vector_impl_data._M_start;
    kVar2 = pKVar3->levelCount;
    uVar11 = pKVar3[1].levelCount;
    local_ec = kVar2 + (kVar2 == 0);
    uVar15 = uVar11 + (uVar11 == 0);
    uVar4 = local_ec;
    if (local_ec < uVar11) {
      uVar4 = uVar15;
    }
    local_c8 = (char *)(ulong)uVar4;
    pcVar13 = (char *)0x0;
    local_c0 = streams;
    do {
      local_70 = 0;
      local_50 = 0;
      puVar14 = &local_88;
      iVar10 = 0;
      uVar11 = local_ec;
      bVar9 = true;
      do {
        bVar12 = bVar9;
        if (pcVar13 < (char *)(ulong)uVar11) {
          local_40 = 0xf;
          pcStack_38 = "the level index";
          read(local_d0,iVar10 * 0x3b8 + (int)streams,(void *)((long)pcVar13 * 0x18 + 0x50),
               (size_t)&local_140);
          *puVar14 = (unsigned_long)local_140._vptr_DiffBase;
          puVar14[1] = local_140.textHeader._M_len;
          puVar14[2] = (unsigned_long)local_140.textHeader._M_str;
          if ((char)puVar14[3] == '\0') {
            *(undefined1 *)(puVar14 + 3) = 1;
          }
        }
        iVar10 = 1;
        puVar14 = &local_68;
        uVar11 = uVar15;
        bVar9 = false;
      } while (bVar12);
      fmt.size_ = 2;
      fmt.data_ = (char *)0x12;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_188;
      local_188._M_dataplus._M_p = pcVar13;
      ::fmt::v10::vformat_abi_cxx11_(&local_168,(v10 *)"Level{}.byteOffset",fmt,args);
      sVar6 = local_168._M_string_length;
      _Var5._M_p = local_168._M_dataplus._M_p;
      fmt_00.size_ = 2;
      fmt_00.data_ = (char *)0x1b;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_e8;
      local_e8[0] = pcVar13;
      ::fmt::v10::vformat_abi_cxx11_(&local_188,(v10 *)"/index/levels/{}/byteOffset",fmt_00,args_00)
      ;
      bVar8 = local_50;
      bVar7 = local_70;
      if ((local_70 & 1) != 0) {
        local_90 = local_88;
      }
      if (local_50 != 0) {
        local_98 = local_68;
      }
      local_140.textHeader._M_len = sVar6;
      local_140.textHeader._M_str = _Var5._M_p;
      local_140.jsonPath._M_len = local_188._M_string_length;
      local_140.jsonPath._M_str = local_188._M_dataplus._M_p;
      local_140.different = (bool)(local_90 != local_98 & local_70 | local_70 != local_50);
      local_140.values[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_90;
      local_140.values[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_70;
      local_140.values[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_98;
      local_140.values[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_50;
      local_140._vptr_DiffBase = (_func_int **)&PTR_value_abi_cxx11__0025c3c8;
      PrintDiff::operator<<(local_148,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      fmt_01.size_ = 2;
      fmt_01.data_ = (char *)0x12;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_188;
      local_188._M_dataplus._M_p = pcVar13;
      ::fmt::v10::vformat_abi_cxx11_(&local_168,(v10 *)"Level{}.byteLength",fmt_01,args_01);
      sVar6 = local_168._M_string_length;
      _Var5._M_p = local_168._M_dataplus._M_p;
      fmt_02.size_ = 2;
      fmt_02.data_ = (char *)0x1b;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)local_e8;
      local_e8[0] = pcVar13;
      ::fmt::v10::vformat_abi_cxx11_(&local_188,(v10 *)"/index/levels/{}/byteLength",fmt_02,args_02)
      ;
      if ((bVar7 & 1) != 0) {
        local_a8 = uStack_80;
      }
      if (bVar8 != 0) {
        local_a0 = local_60;
      }
      local_140.textHeader._M_len = sVar6;
      local_140.textHeader._M_str = _Var5._M_p;
      local_140.jsonPath._M_len = local_188._M_string_length;
      local_140.jsonPath._M_str = local_188._M_dataplus._M_p;
      local_140.different = (bool)(bVar7 != bVar8 | local_a8 != local_a0 & bVar7);
      local_140.values[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_a8;
      local_140.values[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = (bool)bVar7;
      local_140.values[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_a0;
      local_140.values[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = (bool)bVar8;
      local_140._vptr_DiffBase = (_func_int **)&PTR_value_abi_cxx11__0025c408;
      PrintDiff::operator<<(local_148,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      fmt_03.size_ = 2;
      fmt_03.data_ = (char *)0x1e;
      args_03.field_1.values_ = in_R9.values_;
      args_03.desc_ = (unsigned_long_long)&local_188;
      local_188._M_dataplus._M_p = pcVar13;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_168,(v10 *)"Level{}.uncompressedByteLength",fmt_03,args_03);
      sVar6 = local_168._M_string_length;
      _Var5._M_p = local_168._M_dataplus._M_p;
      fmt_04.size_ = 2;
      fmt_04.data_ = (char *)0x27;
      args_04.field_1.values_ = in_R9.values_;
      args_04.desc_ = (unsigned_long_long)local_e8;
      local_e8[0] = pcVar13;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_188,(v10 *)"/index/levels/{}/uncompressedByteLength",fmt_04,args_04);
      if ((bVar7 & 1) != 0) {
        local_b8 = local_78;
      }
      if (bVar8 != 0) {
        local_b0 = local_58;
      }
      local_140.textHeader._M_len = sVar6;
      local_140.textHeader._M_str = _Var5._M_p;
      local_140.jsonPath._M_len = local_188._M_string_length;
      local_140.jsonPath._M_str = local_188._M_dataplus._M_p;
      local_140.different = (bool)(bVar7 != bVar8 | bVar7 & local_b8 != local_b0);
      local_140.values[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_b8;
      local_140.values[0].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = (bool)bVar7;
      local_140.values[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_b0;
      local_140.values[1].super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = (bool)bVar8;
      local_140._vptr_DiffBase = (_func_int **)&PTR_value_abi_cxx11__0025c408;
      PrintDiff::operator<<(local_148,&local_140);
      streams = local_c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = pcVar13 + 1;
    } while (pcVar13 != local_c8);
  }
  return;
}

Assistant:

void CommandCompare::compareLevelIndex(PrintDiff& diff, InputStreams& streams) {
    if (options.ignoreIndex != IgnoreIndex::none) return;

    diff.setContext("Level Index\n\n");

    const uint32_t numLevels[] = {
        std::max(1u, headers[0].levelCount),
        std::max(1u, headers[1].levelCount)
    };
    const uint32_t maxNumLevels = std::max(numLevels[0], numLevels[1]);

    for (uint32_t level = 0; level < maxNumLevels; ++level) {
        const auto levelIndexEntryOffset = sizeof(KTX_header2) + level * sizeof(ktxLevelIndexEntry);
        std::optional<ktxLevelIndexEntry> levelIndexEntry[2];
        for (std::size_t i = 0; i < streams.size(); ++i)
            if (level < numLevels[i]) {
                ktxLevelIndexEntry entry;
                read(streams[i], levelIndexEntryOffset, &entry, sizeof(entry), "the level index");
                levelIndexEntry[i] = entry;
            }

        diff << DiffHex(fmt::format("Level{}.byteOffset", level),
            fmt::format("/index/levels/{}/byteOffset", level),
            OPT_FIELDS(levelIndexEntry, byteOffset));
        diff << Diff(fmt::format("Level{}.byteLength", level),
            fmt::format("/index/levels/{}/byteLength", level),
            OPT_FIELDS(levelIndexEntry, byteLength));
        diff << Diff(fmt::format("Level{}.uncompressedByteLength", level),
            fmt::format("/index/levels/{}/uncompressedByteLength", level),
            OPT_FIELDS(levelIndexEntry, uncompressedByteLength));
    }
}